

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void __thiscall LLVMBC::LLVMContext::allocate_new_chain(LLVMContext *this,size_t size,size_t align)

{
  pointer *pppvVar1;
  iterator __position;
  size_t size_00;
  void *ptr;
  void *local_18;
  
  size_00 = 0x10000;
  if (0x10000 < size + align) {
    size_00 = size + align;
  }
  local_18 = ::dxil_spv::allocate_in_thread(size_00);
  if (local_18 == (void *)0x0) {
    this->current_block = 0;
    this->current_block_end = 0;
  }
  else {
    __position._M_current =
         (this->raw_allocations).super__Vector_base<void_*,_dxil_spv::ThreadLocalAllocator<void_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->raw_allocations).super__Vector_base<void_*,_dxil_spv::ThreadLocalAllocator<void_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,dxil_spv::ThreadLocalAllocator<void*>>::_M_realloc_insert<void*const&>
                ((vector<void*,dxil_spv::ThreadLocalAllocator<void*>> *)&this->raw_allocations,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppvVar1 = &(this->raw_allocations).
                  super__Vector_base<void_*,_dxil_spv::ThreadLocalAllocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + 1;
    }
    this->current_block = (uintptr_t)local_18;
    this->current_block_end = size_00 + (long)local_18;
  }
  return;
}

Assistant:

void LLVMContext::allocate_new_chain(size_t size, size_t align)
{
	size_t min_size = size + align;
	if (min_size < 64 * 1024)
		min_size = 64 * 1024;

	void *ptr = dxil_spv::allocate_in_thread(min_size);
	if (ptr)
	{
		raw_allocations.push_back(ptr);
		current_block = reinterpret_cast<uintptr_t>(ptr);
		current_block_end = current_block + min_size;
	}
	else
	{
		current_block = 0;
		current_block_end = 0;
	}
}